

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprint.cpp
# Opt level: O1

InputSlot *
QPrintUtils::paperBinToInputSlot(InputSlot *__return_storage_ptr__,int windowsId,QString *name)

{
  long lVar1;
  InputSlotMap *pIVar2;
  long lVar3;
  InputSlotId IVar4;
  int iVar5;
  
  __return_storage_ptr__->id = 0xaaaaaaaa;
  __return_storage_ptr__->windowsId = -0x55555556;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = (char *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  QString::operator=(&__return_storage_ptr__->name,name);
  if (windowsId == 1) {
    iVar5 = 1;
    pIVar2 = inputSlotMap;
    IVar4 = OnlyOne;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0xf0) {
        IVar4 = *(InputSlotId *)((long)&inputSlotMap[1].id + lVar3);
        QByteArray::operator=(&__return_storage_ptr__->key,"");
        goto LAB_0012db9f;
      }
      iVar5 = *(int *)((long)&inputSlotMap[1].windowsId + lVar3);
      lVar1 = lVar3 + 0x10;
    } while (iVar5 != windowsId);
    pIVar2 = (InputSlotMap *)(lVar3 + 0x165840);
    IVar4 = *(InputSlotId *)((long)&inputSlotMap[1].id + lVar3);
  }
  QByteArray::operator=(&__return_storage_ptr__->key,pIVar2->key);
  windowsId = iVar5;
LAB_0012db9f:
  __return_storage_ptr__->id = IVar4;
  __return_storage_ptr__->windowsId = windowsId;
  return __return_storage_ptr__;
}

Assistant:

QPrint::InputSlot paperBinToInputSlot(int windowsId, const QString &name)
{
    QPrint::InputSlot slot;
    slot.name = name;
    int i;
    for (i = 0; inputSlotMap[i].id != QPrint::CustomInputSlot; ++i) {
        if (inputSlotMap[i].windowsId == windowsId) {
            slot.key = inputSlotMap[i].key;
            slot.id = inputSlotMap[i].id;
            slot.windowsId = inputSlotMap[i].windowsId;
            return slot;
        }
    }
    slot.key = inputSlotMap[i].key;
    slot.id = inputSlotMap[i].id;
    slot.windowsId = windowsId;
    return slot;
}